

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cumulativeCalendar.cpp
# Opt level: O1

int __thiscall
CumulativeCalProp::ttef_analyse_tasks_right_shift
          (CumulativeCalProp *this,int begin,int end,int dur_in,int task,int max_dur_lift,
          int *last_dur)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  int *piVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  int *piVar13;
  int iVar14;
  
  iVar1 = (this->start).data[(uint)task]->max0;
  if (max_dur_lift < dur_in) {
    piVar13 = this->lst_2;
    iVar10 = piVar13[task];
    iVar14 = end;
    if (iVar10 < end) {
      iVar14 = iVar10;
    }
    lVar7 = (long)(this->taskCalendar).data[(uint)task];
    if (iVar14 <= begin) {
      iVar14 = begin;
    }
    piVar3 = this->lct_2;
    iVar6 = piVar3[task];
    if (end <= iVar6) {
      iVar6 = end;
    }
    if (this->rho == 1) {
      iVar6 = iVar6 - iVar14;
    }
    else {
      iVar6 = this->workingPeriods[lVar7 + -1][iVar14] - this->workingPeriods[lVar7 + -1][iVar6];
    }
    piVar4 = this->calendar[lVar7 + -1];
    *last_dur = iVar6;
    uVar2 = piVar13[task];
    uVar11 = (ulong)uVar2;
    if ((int)uVar2 < iVar1) {
      iVar14 = piVar3[task];
      do {
        iVar6 = iVar6 - (uint)(begin <= iVar10);
        iVar9 = (int)uVar11;
        if (piVar4[(long)iVar9 + 1] == 0) {
          uVar12 = (long)iVar9 + 1;
          do {
            iVar6 = iVar6 - (uint)((long)begin <= (long)uVar12 && this->rho == 1);
            uVar11 = uVar12 + 1;
            bVar5 = (long)uVar12 < (long)iVar1;
            if ((long)iVar1 <= (long)uVar12) break;
            lVar7 = uVar12 + 1;
            uVar12 = uVar11;
          } while (piVar4[lVar7] == 0);
        }
        else {
          uVar11 = (ulong)(iVar9 + 1);
          bVar5 = true;
        }
        if (!bVar5) {
          return iVar10;
        }
        iVar9 = iVar14 + 1;
        iVar8 = iVar14;
        if (piVar4[iVar14] == 0) {
          piVar13 = piVar4 + (iVar14 + 1);
          do {
            iVar8 = iVar14;
            iVar6 = iVar6 + (uint)(iVar8 < end && this->rho == 1);
            iVar9 = *piVar13;
            piVar13 = piVar13 + 1;
            iVar14 = iVar8 + 1;
          } while (iVar9 == 0);
          iVar9 = iVar8 + 2;
          iVar8 = iVar8 + 1;
        }
        iVar14 = iVar9;
        iVar6 = (uint)(iVar8 < end) + iVar6;
        if (iVar6 < dur_in - max_dur_lift) {
          return iVar10;
        }
        *last_dur = iVar6;
        iVar10 = (int)uVar11;
      } while (iVar10 < iVar1);
    }
  }
  else {
    *last_dur = 0;
    iVar10 = iVar1;
  }
  return iVar10;
}

Assistant:

int CumulativeCalProp::ttef_analyse_tasks_right_shift(const int begin, const int end,
																											const int dur_in, const int task,
																											const int max_dur_lift, int& last_dur) {
	// Some assumptions
	assert(est_2[task] < end && begin < lct_2[task]);

	// Defining some constants
	const int lst0 = max_start0(task);
	if (dur_in <= max_dur_lift) {
		last_dur = 0;
		return lst0;
	}
	// Defining more constants
	const int cal_idx = taskCalendar[task] - 1;
	const int* wPeriods = workingPeriods[cal_idx];
	const int* tCal = calendar[cal_idx];
	const int min_dur_in = dur_in - max_dur_lift;
	const int begin_in = std::max(begin, std::min(lst_2[task], end));
	const int end_in = std::min(lct_2[task], end);
	// Defining some variables
	int workDays = (rho == 1 ? end_in - begin_in : wPeriods[begin_in] - wPeriods[end_in]);
	int last_lst = lst_2[task];
	last_dur = workDays;
	int lst = lst_2[task] + 1;
	int lct = lct_2[task] + 1;

	assert(workDays >= dur_in);

	// Determining the latest possible start time and the number of workDays in the time window
	// [begin, end)
	for (; lst <= lst0; lst++, lct++) {
		if (last_lst >= begin) {
			workDays--;
		}
		// Determining the new start time
		assert(tCal[lst - 1] == 1);
		while (tCal[lst] == 0 && lst <= lst0) {
			if (rho == 1 && lst >= begin) {
				workDays--;
			}
			lst++;
		}
		if (lst > lst0) {
			return last_lst;
		}
		// Determining the new end time
		assert(tCal[lct - 2] == 1);
		while (tCal[lct - 1] == 0) {
			if (rho == 1 && lct <= end) {
				workDays++;
			}
			lct++;
		}
		if (lct <= end) {
			workDays++;
		}
		// Check the number of working days in the time window [begin, end)
		if (workDays < min_dur_in) {
			return last_lst;
		}
		// Saving valid shift
		last_lst = lst;
		last_dur = workDays;

		// Some cross checks
		assert(min_dur(task) == wPeriods[last_lst] - wPeriods[lct]);
		assert(rho == 0 || workDays == std::min(end, lct) - std::max(begin, last_lst));
		assert(rho == 1 ||
					 workDays == wPeriods[std::max(begin, last_lst)] - wPeriods[std::min(end, lct)]);
		assert(ttef_analyse_tasks_check_expl_ub(begin, end, task, min_dur_in, last_lst));
	}
	return last_lst;
}